

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (msghash32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msghash32 != NULL";
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "signature != NULL";
  }
  else {
    if (seckey != (uchar *)0x0) {
      iVar1 = secp256k1_ecdsa_sign_inner
                        (ctx,&local_38,&local_58,(int *)0x0,(secp256k1_sha256 *)0x0,
                         (secp256k1_ecdsa_s2c_opening *)0x0,(uchar *)0x0,msghash32,seckey,noncefp,
                         noncedata);
      *(uint64_t *)signature->data = local_38.d[0];
      *(uint64_t *)(signature->data + 8) = local_38.d[1];
      *(uint64_t *)(signature->data + 0x10) = local_38.d[2];
      *(uint64_t *)(signature->data + 0x18) = local_38.d[3];
      *(uint64_t *)(signature->data + 0x20) = local_58.d[0];
      *(uint64_t *)(signature->data + 0x28) = local_58.d[1];
      *(uint64_t *)(signature->data + 0x30) = local_58.d[2];
      *(uint64_t *)(signature->data + 0x38) = local_58.d[3];
      return iVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, NULL, NULL, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}